

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void OpenMesh::IO::assignCustomProperty<char>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar4;
  VPropHandleT<char> local_38;
  undefined4 uStack_34;
  VPropHandleT<char> prop;
  char in;
  
  _local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),0xffffffff);
  iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  bVar2 = BaseKernel::get_property_handle<char>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar3),&local_38,_propName);
  if (!bVar2) {
    iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<char>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar3),&local_38,_propName);
  }
  std::operator>>(_in,(char *)((long)&uStack_34 + 3));
  vVar1 = uStack_34._3_1_;
  iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar4 = BaseKernel::property<char>((BaseKernel *)CONCAT44(extraout_var_01,iVar3),local_38,_vh);
  *pvVar4 = vVar1;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}